

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
MXNetNode::attr_ai(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MXNetNode *this,
                  char *key)

{
  iterator __position;
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  int nconsumed;
  int i;
  int local_54;
  key_type local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,key,(allocator<char> *)&local_54);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->attrs)._M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->attrs)._M_t._M_impl.super__Rb_tree_header) {
    local_50._M_dataplus._M_p._0_4_ = 0;
    local_54 = 0;
    iVar1 = __isoc99_sscanf(*(undefined8 *)(cVar2._M_node + 2),"%*[(,]%d%n");
    if (iVar1 == 1) {
      lVar3 = 0;
      do {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                     (int *)&local_50);
        }
        else {
          *__position._M_current = (int)local_50._M_dataplus._M_p;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        local_50._M_dataplus._M_p._0_4_ = 0;
        lVar3 = (long)(int)lVar3 + (long)local_54;
        iVar1 = __isoc99_sscanf(lVar3 + *(long *)(cVar2._M_node + 2),"%*[(,]%d%n",&local_50,
                                &local_54);
      } while (iVar1 == 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> MXNetNode::attr_ai(const char* key) const
{
    const std::map<std::string, std::string>::const_iterator it = attrs.find(key);
    if (it == attrs.end())
        return std::vector<int>();

    // (1,2,3)
    std::vector<int> list;

    int i = 0;
    int c = 0;
    int nconsumed = 0;
    int nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
    while (nscan == 1)
    {
        list.push_back(i);
//         fprintf(stderr, "%d\n", i);

        i = 0;
        c += nconsumed;
        nscan = sscanf(it->second.c_str() + c, "%*[(,]%d%n", &i, &nconsumed);
    }

    return list;
}